

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O3

void v7m_msr_xpsr(CPUARMState *env,uint32_t mask,uint32_t reg,uint32_t val)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = -(reg & 1) & 0x1ff;
  if ((reg & 4) == 0) {
    uVar2 = uVar1;
    if ((mask & 8) != 0) {
      uVar2 = uVar1 + 0xf8000000;
    }
    uVar1 = uVar2;
    if (((mask & 4) != 0) && (uVar1 = uVar2 | 0xf0000, (env->features & 0x400000000) == 0)) {
      uVar1 = uVar2;
    }
  }
  uVar2 = uVar1 | 0x700fc00;
  if ((reg & 2) == 0) {
    uVar2 = uVar1;
  }
  if (0xfffffff < uVar2) {
    env->ZF = ~val & 0x40000000;
    env->NF = val;
    env->CF = val >> 0x1d & 1;
    env->VF = val * 8 & 0x80000000;
  }
  if ((uVar2 >> 0x1b & 1) != 0) {
    env->QF = val >> 0x1b & 1;
  }
  if ((uVar2 & 0xf0000) != 0) {
    env->GE = val >> 0x10 & 0xf;
  }
  if ((uVar2 >> 0x18 & 1) != 0) {
    env->thumb = val >> 0x18 & 1;
  }
  if ((uVar2 & 0x6000000) != 0) {
    env->condexec_bits = val >> 0x19 & 3 | env->condexec_bits & 0xfffffffc;
  }
  if ((uVar2 & 0xfc00) != 0) {
    env->condexec_bits = val >> 8 & 0xfc | env->condexec_bits & 3;
  }
  if ((uVar2 & 0x1ff) == 0) {
    return;
  }
  write_v7m_exception_arm(env,val & 0x1ff);
  return;
}

Assistant:

static void v7m_msr_xpsr(CPUARMState *env, uint32_t mask, uint32_t reg,
                         uint32_t val)
{
    uint32_t xpsrmask = 0;

    if (reg & 1) {
        xpsrmask |= XPSR_EXCP;
    }

    if (!(reg & 4)) {
        if (mask & 8) {
            xpsrmask |= XPSR_NZCV | XPSR_Q;
        }
        if ((mask & 4) && arm_feature(env, ARM_FEATURE_THUMB_DSP)) {
            xpsrmask |= XPSR_GE;
        }
    }

    if (reg & 2) {
        xpsrmask |= (XPSR_IT_0_1 | XPSR_IT_2_7 | XPSR_T);
    }

    xpsr_write(env, val, xpsrmask);
}